

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::ClearConfig(FConfigFile *this)

{
  FConfigSection *pFVar1;
  FConfigSection *this_00;
  FConfigSection *next;
  FConfigFile *this_local;
  
  this->CurrentSection = this->Sections;
  while (this->CurrentSection != (FConfigSection *)0x0) {
    pFVar1 = this->CurrentSection->Next;
    ClearCurrentSection(this);
    this_00 = this->CurrentSection;
    if (this_00 != (FConfigSection *)0x0) {
      FConfigSection::~FConfigSection(this_00);
      operator_delete(this_00,0x28);
    }
    this->CurrentSection = pFVar1;
  }
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  return;
}

Assistant:

void FConfigFile::ClearConfig ()
{
	CurrentSection = Sections;
	while (CurrentSection != NULL)
	{
		FConfigSection *next = CurrentSection->Next;
		ClearCurrentSection ();
		delete CurrentSection;
		CurrentSection = next;
	}
	Sections = NULL;
	LastSectionPtr = &Sections;
}